

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_order(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  int second;
  int first;
  uv_timer_t handle_b;
  uv_timer_t handle_a;
  
  first = 0;
  second = 1;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&handle_a);
  eval_b = (int64_t)iVar1;
  handle_b.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&handle_b);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_b == (void *)0x0) {
      handle_a.data = &first;
      iVar1 = uv_timer_start(&handle_a,order_cb_a,0,0);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if ((void *)eval_b == (void *)0x0) {
        handle_b.data = &second;
        iVar1 = uv_timer_start(&handle_b,order_cb_b,0,0);
        eval_b = (int64_t)iVar1;
        eval_b_1 = 0;
        if ((void *)eval_b == (void *)0x0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          eval_b = (int64_t)iVar1;
          eval_b_1 = 0;
          if ((void *)eval_b == (void *)0x0) {
            eval_b = 2;
            eval_b_1 = (int64_t)order_cb_called;
            if (eval_b_1 == 2) {
              iVar1 = uv_timer_stop(&handle_a);
              eval_b = (int64_t)iVar1;
              eval_b_1 = 0;
              if ((void *)eval_b == (void *)0x0) {
                iVar1 = uv_timer_stop(&handle_b);
                eval_b = (int64_t)iVar1;
                eval_b_1 = 0;
                if ((void *)eval_b == (void *)0x0) {
                  order_cb_called = 0;
                  handle_b.data = &first;
                  iVar1 = uv_timer_start(&handle_b,order_cb_b,0,0);
                  eval_b = (int64_t)iVar1;
                  eval_b_1 = 0;
                  if ((void *)eval_b == (void *)0x0) {
                    handle_a.data = &second;
                    iVar1 = uv_timer_start(&handle_a,order_cb_a,0,0);
                    eval_b = (int64_t)iVar1;
                    eval_b_1 = 0;
                    if ((void *)eval_b == (void *)0x0) {
                      puVar2 = uv_default_loop();
                      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                      eval_b = (int64_t)iVar1;
                      eval_b_1 = 0;
                      if ((void *)eval_b == (void *)0x0) {
                        eval_b = 2;
                        eval_b_1 = (int64_t)order_cb_called;
                        if (eval_b_1 == 2) {
                          puVar2 = uv_default_loop();
                          close_loop(puVar2);
                          eval_b = 0;
                          puVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar2);
                          eval_b_1 = (int64_t)iVar1;
                          if (eval_b_1 == 0) {
                            uv_library_shutdown();
                            return 0;
                          }
                          pcVar5 = "uv_loop_close(uv_default_loop())";
                          pcVar4 = "0";
                          uVar3 = 0xf1;
                        }
                        else {
                          pcVar5 = "order_cb_called";
                          pcVar4 = "2";
                          uVar3 = 0xef;
                        }
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                        uVar3 = 0xed;
                      }
                    }
                    else {
                      pcVar5 = "0";
                      pcVar4 = "uv_timer_start(&handle_a, order_cb_a, 0, 0)";
                      uVar3 = 0xec;
                    }
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "uv_timer_start(&handle_b, order_cb_b, 0, 0)";
                    uVar3 = 0xe9;
                  }
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "uv_timer_stop(&handle_b)";
                  uVar3 = 0xe4;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_timer_stop(&handle_a)";
                uVar3 = 0xe3;
              }
            }
            else {
              pcVar5 = "order_cb_called";
              pcVar4 = "2";
              uVar3 = 0xe1;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar3 = 0xdf;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_timer_start(&handle_b, order_cb_b, 0, 0)";
          uVar3 = 0xde;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_timer_start(&handle_a, order_cb_a, 0, 0)";
        uVar3 = 0xdc;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_timer_init(uv_default_loop(), &handle_b)";
      uVar3 = 0xd8;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_timer_init(uv_default_loop(), &handle_a)";
    uVar3 = 0xd7;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(timer_order) {
  int first;
  int second;
  uv_timer_t handle_a;
  uv_timer_t handle_b;

  first = 0;
  second = 1;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_a));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_b));

  /* Test for starting handle_a then handle_b */
  handle_a.data = &first;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  handle_b.data = &second;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  ASSERT_OK(uv_timer_stop(&handle_a));
  ASSERT_OK(uv_timer_stop(&handle_b));

  /* Test for starting handle_b then handle_a */
  order_cb_called = 0;
  handle_b.data = &first;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));

  handle_a.data = &second;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}